

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugstream.cpp
# Opt level: O2

void __thiscall MetaSim::DebugStream::enter(DebugStream *this,string *s,string *header)

{
  ostream *poVar1;
  string sStack_38;
  
  std::__cxx11::string::string((string *)&sStack_38,(string *)s);
  enter(this,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  if ((this->_isDebug != false) || ((this->_isDebugAll & 1U) != 0)) {
    indent(this);
    poVar1 = std::operator<<(this->_os,(string *)header);
    std::endl<char,std::char_traits<char>>(poVar1);
    this->_isIndenting = true;
    this->_indentLevel = this->_indentLevel + 1;
  }
  return;
}

Assistant:

void DebugStream::enter(std::string s, std::string header) 
    {
        enter(s);
        if (filter()) {
            indent();
            (*_os) << header << endl;
            resetIndent();
            _indentLevel++;
        }
    }